

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.h
# Opt level: O3

int CG<TPZMatrix<long_double>,TPZFMatrix<long_double>,TPZMatrixSolver<long_double>,double>
              (TPZMatrix<long_double> *A,TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *b,
              TPZMatrixSolver<long_double> *M,TPZFMatrix<long_double> *residual,int64_t *max_iter,
              double *tol,int FromCurrent)

{
  double dVar1;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  TPZFMatrix<long_double> *this;
  longdouble lVar5;
  longdouble in_ST1;
  longdouble in_ST3;
  longdouble lVar6;
  longdouble lVar7;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar8;
  longdouble in_ST7;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  TPZFMatrix<long_double> resbackup;
  TPZFMatrix<long_double> q;
  TPZFMatrix<long_double> z;
  TPZFMatrix<long_double> p;
  TPZFMatrix<long_double> local_270;
  TPZFMatrix<long_double> local_1e0;
  TPZFMatrix<long_double> local_150;
  TPZFMatrix<long_double> local_c0;
  
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_c0.fElem = (longdouble *)0x0;
  local_c0.fGiven = (longdouble *)0x0;
  local_c0.fSize = 0;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_c0.fWork.fStore = (longdouble *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_150.fElem = (longdouble *)0x0;
  local_150.fGiven = (longdouble *)0x0;
  local_150.fSize = 0;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_150.fWork.fStore = (longdouble *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_1e0.fElem = (longdouble *)0x0;
  local_1e0.fGiven = (longdouble *)0x0;
  local_1e0.fSize = 0;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_1e0.fWork.fStore = (longdouble *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  Dot<long_double>(b,b);
  lVar6 = in_ST7;
  sqrtl();
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_270.fElem = (longdouble *)0x0;
  local_270.fGiven = (longdouble *)0x0;
  local_270.fSize = 0;
  TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
  local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
  local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_270.fPivot.super_TPZVec<int>.fNElements = 0;
  local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_270.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_270.fWork.fStore = (longdouble *)0x0;
  local_270.fWork.fNElements = 0;
  local_270.fWork.fNAlloc = 0;
  this = &local_270;
  if (residual != (TPZFMatrix<long_double> *)0x0) {
    this = residual;
  }
  if (FromCurrent == 0) {
    (*(x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              ();
    TPZFMatrix<long_double>::operator=(this,b);
  }
  else {
    lVar6 = in_ST7;
    (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])(A,x,b,this,0);
  }
  lVar7 = lVar6;
  Dot<long_double>(this,this);
  uVar9 = -(ulong)((double)in_ST1 == 0.0);
  dVar12 = (double)(~uVar9 & (ulong)(double)in_ST1 | uVar9 & 0x3ff0000000000000);
  lVar8 = lVar7;
  sqrtl();
  dVar11 = (double)in_ST3 / dVar12;
  if (dVar11 <= *tol) {
    lVar4 = 0;
LAB_00c49c45:
    iVar3 = 0;
    *tol = dVar11;
    *max_iter = lVar4;
  }
  else {
    if (0 < *max_iter) {
      lVar4 = 0;
      dVar10 = 0.0;
      do {
        (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,this,&local_150,0);
        Dot<long_double>(this,&local_150);
        dVar1 = (double)in_ST4;
        if (lVar4 == 0) {
          TPZFMatrix<long_double>::operator=(&local_c0,&local_150);
          lVar5 = in_ST7;
          in_ST4 = lVar6;
          in_ST7 = lVar8;
        }
        else {
          TPZFMatrix<long_double>::TimesBetaPlusZ(&local_c0,(longdouble)(dVar1 / dVar10),&local_150)
          ;
          lVar5 = in_ST7;
          in_ST4 = lVar6;
          in_ST7 = lVar8;
        }
        (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])(A,&local_c0,&local_1e0);
        lVar6 = in_ST7;
        Dot<long_double>(&local_c0,&local_1e0);
        TPZFMatrix<long_double>::ZAXPY(x,(longdouble)(dVar1 / (double)in_ST5),&local_c0);
        TPZFMatrix<long_double>::ZAXPY(this,(longdouble)-(dVar1 / (double)in_ST5),&local_1e0);
        in_ST5 = lVar7;
        lVar7 = lVar6;
        Dot<long_double>(this,this);
        lVar8 = lVar7;
        sqrtl();
        dVar11 = (double)lVar5 / dVar12;
        lVar4 = lVar4 + 1;
        if (dVar11 <= *tol) goto LAB_00c49c45;
        dVar10 = dVar1;
      } while (lVar4 < *max_iter);
    }
    *tol = dVar11;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cg iter = ",10);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," res = ",7);
    poVar2 = std::ostream::_M_insert<double>(dVar11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    iVar3 = 1;
    std::ostream::flush();
  }
  TPZFMatrix<long_double>::~TPZFMatrix(&local_270);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_1e0);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_150);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_c0);
  return iVar3;
}

Assistant:

int
CG( Matrix &A, Vector &x, const Vector &b,
   Preconditioner &M, Vector *residual, int64_t &max_iter, Real &tol,const int FromCurrent)
{
	Real resid;
	Vector p, z, q;
	REAL alpha, beta, rho, rho_1 = 0;
	
    REAL normb = TPZExtractVal::val(Norm(b));
	Vector resbackup;
	Vector *res = residual;
	
#ifdef TEST
	std::list< TPZFMatrix<REAL> > plist,qlist;
	std::list< TPZFMatrix<REAL> >::iterator jt;
	std::list< TPZFMatrix<REAL> >::iterator kt;
	Vector Au;
#endif
	
	if(!res) res = &resbackup;
	Vector &r = *res;
	//  Vector r = b - A*x;
	if(FromCurrent) 
    {
        A.MultAdd(x,b,r,-1.,1.);
    }
	else {
		x.Zero();
		r = b;
	}
	
	if (normb == 0.0)
		normb = 1.0;
	
    if ((resid = (TPZExtractVal::val( Norm(r) ) ) / normb) <= tol) {
		tol = resid;
		max_iter = 0;
		return 0;
	}
	int64_t i;
	for (i = 1; i <= max_iter; i++) {
		M.Solve(r,z);
        rho = TPZExtractVal::val(Dot(r, z));
		
		if (i == 1)
			p = z;
		else {
			beta = rho / rho_1;
			p.TimesBetaPlusZ(beta,z);
		}
#ifdef TEST
		
		plist.push_back(p);
#endif	 
		
		A.Multiply(p,q);
		alpha = rho / (TPZExtractVal::val(Dot(p, q)));
		
#ifdef TEST
		qlist.push_back(q);
#endif
		
		x.ZAXPY(alpha,p);
		r.ZAXPY(-alpha,q);
		
#ifdef TEST
		A.Multiply(x,Au);
		REAL energy = Dot(x,Au)/2.-Dot(x,b);
#endif
		
		if ((resid = (TPZExtractVal::val(Norm(r))) / normb) <= tol) {
			tol = resid;
			max_iter = i;
#ifdef PZDEBUG
			std::cout << "cg iter = " << i <<  " res = " << resid << std::endl;
#endif
			return 0;
		}
#ifdef PZDEBUG
		std::cout << "cg iter = " << i <<  " res = " << resid /*<< " energy " << energy */ << std::endl;
#endif
#ifdef TEST
		std::cout << " energy " << energy << std::endl;
		TPZFMatrix<REAL> inner(plist.size(),plist.size(),0.);
		{
			int64_t j,k;
			for(j=0, jt = plist.begin(); jt != plist.end(); jt++,j++)
			{
				for(k=0, kt = qlist.begin(); kt != qlist.end(); kt++,k++)
				{
					inner(j,k) = Dot((*jt),(*kt));
				}
			}
		}
		inner.Print("Inner product of search directions");
#endif
		rho_1 = rho;
	}
	
	tol = resid;
	std::cout << "cg iter = " << i <<  " res = " << resid << std::endl;
	return 1;
}